

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * stmt(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  int *piVar1;
  C_Token *pCVar2;
  _Bool _Var3;
  int iVar4;
  int64_t iVar5;
  C_Type *basety_00;
  C_Token *pCVar6;
  C_Token *pCVar7;
  C_Parser *pCVar8;
  C_MemoryAllocator *pCVar9;
  C_Node *pCVar10;
  C_Node *node_12;
  C_Node *node_11;
  C_Node *node_10;
  C_Node *node_8;
  C_Node *node_9;
  char *cont_2;
  char *brk_3;
  C_Node *node_7;
  char *cont_1;
  char *brk_2;
  C_Node *node_6;
  C_Type *basety;
  char *cont;
  char *brk_1;
  C_Node *node_5;
  C_Node *node_4;
  int end;
  int begin;
  C_Node *node_3;
  char *brk;
  C_Node *sw;
  C_Node *node_2;
  C_Node *node_1;
  C_Type *ty;
  C_Node *exp;
  C_Node *node;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  node = (C_Node *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  _Var3 = C_equal(tok,"return");
  if (_Var3) {
    pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_RETURN,(C_Token *)node);
    _Var3 = C_consume((C_Token **)tok_local,(C_Token *)node->next,";");
    parser_local = pCVar8;
    if (!_Var3) {
      ty = (C_Type *)expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
      pCVar7 = C_skip((C_Parser *)rest_local,(C_Token *)node,";");
      *(C_Token **)tok_local = pCVar7;
      C_add_type((C_Parser *)rest_local,(C_Node *)ty);
      piVar1 = *(int **)(rest_local[7]->val + 0x58);
      if ((*piVar1 != 0xe) && (*piVar1 != 0xf)) {
        ty = (C_Type *)
             C_new_cast((C_Parser *)rest_local,(C_Node *)ty,*(C_Type **)(rest_local[7]->val + 0x58))
        ;
      }
      pCVar8->locals = (C_Obj *)ty;
    }
  }
  else {
    _Var3 = C_equal((C_Token *)node,"if");
    if (_Var3) {
      pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_IF,(C_Token *)node);
      node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node->next,"(");
      pCVar10 = expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
      pCVar8->scope = (C_Scope *)pCVar10;
      node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,")");
      pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
      pCVar8->current_fn = (C_Obj *)pCVar10;
      _Var3 = C_equal((C_Token *)node,"else");
      if (_Var3) {
        pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
        pCVar8->gotos = pCVar10;
      }
      *(C_Node **)tok_local = node;
      parser_local = pCVar8;
    }
    else {
      _Var3 = C_equal((C_Token *)node,"switch");
      if (_Var3) {
        pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_SWITCH,(C_Token *)node);
        node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node->next,"(");
        pCVar10 = expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
        pCVar8->scope = (C_Scope *)pCVar10;
        node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,")");
        pCVar7 = rest_local[0xc];
        rest_local[0xc] = (C_Token *)pCVar8;
        pCVar2 = rest_local[10];
        pCVar6 = (C_Token *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
        pCVar8->cont_label = (char *)pCVar6;
        rest_local[10] = pCVar6;
        pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)node);
        pCVar8->current_fn = (C_Obj *)pCVar10;
        rest_local[0xc] = pCVar7;
        rest_local[10] = pCVar2;
        parser_local = pCVar8;
      }
      else {
        _Var3 = C_equal((C_Token *)node,"case");
        if (_Var3) {
          if (rest_local[0xc] == (C_Token *)0x0) {
            C_error_tok((C_Parser *)rest_local,(C_Token *)node,"stray case");
          }
          pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_CASE,(C_Token *)node);
          iVar5 = C_const_expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
          iVar4 = (int)iVar5;
          _Var3 = C_equal((C_Token *)node,"...");
          node_4._0_4_ = iVar4;
          if (_Var3) {
            iVar5 = C_const_expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
            node_4._0_4_ = (int)iVar5;
            if ((int)iVar5 < iVar4) {
              C_error_tok((C_Parser *)rest_local,(C_Token *)node,"empty case range specified");
            }
          }
          node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,":");
          pCVar9 = (C_MemoryAllocator *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
          (pCVar8->typewords).allocator = pCVar9;
          pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)node);
          pCVar8->locals = (C_Obj *)pCVar10;
          pCVar8->env[0].__jmpbuf[3] = (long)iVar4;
          pCVar8->env[0].__jmpbuf[4] = (long)(int)node_4;
          pCVar8->env[0].__jmpbuf[1] = (long)rest_local[0xc][1].loc;
          rest_local[0xc][1].loc = (char *)pCVar8;
          parser_local = pCVar8;
        }
        else {
          _Var3 = C_equal((C_Token *)node,"default");
          if (_Var3) {
            if (rest_local[0xc] == (C_Token *)0x0) {
              C_error_tok((C_Parser *)rest_local,(C_Token *)node,"stray default");
            }
            pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_CASE,(C_Token *)node);
            node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node->next,":");
            pCVar9 = (C_MemoryAllocator *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
            (pCVar8->typewords).allocator = pCVar9;
            pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)node);
            pCVar8->locals = (C_Obj *)pCVar10;
            *(C_Parser **)&rest_local[0xc][1].len = pCVar8;
            parser_local = pCVar8;
          }
          else {
            _Var3 = C_equal((C_Token *)node,"for");
            if (_Var3) {
              pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_FOR,(C_Token *)node);
              node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node->next,"(");
              enter_scope((C_Parser *)rest_local);
              pCVar7 = rest_local[10];
              pCVar2 = rest_local[0xb];
              pCVar6 = (C_Token *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
              pCVar8->cont_label = (char *)pCVar6;
              rest_local[10] = pCVar6;
              pCVar10 = (C_Node *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
              pCVar8->current_switch = pCVar10;
              rest_local[0xb] = (C_Token *)pCVar10;
              _Var3 = is_typename((C_Parser *)rest_local,(C_Token *)node);
              if (_Var3) {
                basety_00 = declspec((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node,
                                     (VarAttr *)0x0);
                pCVar10 = declaration((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node,
                                      basety_00,(VarAttr *)0x0);
                pCVar8->labels = pCVar10;
              }
              else {
                pCVar10 = expr_stmt((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
                pCVar8->labels = pCVar10;
              }
              _Var3 = C_equal((C_Token *)node,";");
              if (!_Var3) {
                pCVar10 = expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
                pCVar8->scope = (C_Scope *)pCVar10;
              }
              node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,";");
              _Var3 = C_equal((C_Token *)node,")");
              if (!_Var3) {
                pCVar10 = expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
                pCVar8->brk_label = (char *)pCVar10;
              }
              node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,")");
              pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)node);
              pCVar8->current_fn = (C_Obj *)pCVar10;
              leave_scope((C_Parser *)rest_local);
              rest_local[10] = pCVar7;
              rest_local[0xb] = pCVar2;
              parser_local = pCVar8;
            }
            else {
              _Var3 = C_equal((C_Token *)node,"while");
              if (_Var3) {
                pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_FOR,(C_Token *)node);
                node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node->next,"(");
                pCVar10 = expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
                pCVar8->scope = (C_Scope *)pCVar10;
                node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,")");
                pCVar7 = rest_local[10];
                pCVar2 = rest_local[0xb];
                pCVar6 = (C_Token *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
                pCVar8->cont_label = (char *)pCVar6;
                rest_local[10] = pCVar6;
                pCVar10 = (C_Node *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
                pCVar8->current_switch = pCVar10;
                rest_local[0xb] = (C_Token *)pCVar10;
                pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)node);
                pCVar8->current_fn = (C_Obj *)pCVar10;
                rest_local[10] = pCVar7;
                rest_local[0xb] = pCVar2;
                parser_local = pCVar8;
              }
              else {
                _Var3 = C_equal((C_Token *)node,"do");
                if (_Var3) {
                  pCVar8 = (C_Parser *)new_node((C_Parser *)rest_local,ND_DO,(C_Token *)node);
                  pCVar7 = rest_local[10];
                  pCVar2 = rest_local[0xb];
                  pCVar6 = (C_Token *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
                  pCVar8->cont_label = (char *)pCVar6;
                  rest_local[10] = pCVar6;
                  pCVar10 = (C_Node *)new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
                  pCVar8->current_switch = pCVar10;
                  rest_local[0xb] = (C_Token *)pCVar10;
                  pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
                  pCVar8->current_fn = (C_Obj *)pCVar10;
                  rest_local[10] = pCVar7;
                  rest_local[0xb] = pCVar2;
                  node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,"while");
                  node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,"(");
                  pCVar10 = expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
                  pCVar8->scope = (C_Scope *)pCVar10;
                  node = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)node,")");
                  pCVar7 = C_skip((C_Parser *)rest_local,(C_Token *)node,";");
                  *(C_Token **)tok_local = pCVar7;
                  parser_local = pCVar8;
                }
                else {
                  _Var3 = C_equal((C_Token *)node,"asm");
                  if (_Var3) {
                    parser_local = (C_Parser *)
                                   asm_stmt((C_Parser *)rest_local,(C_Token **)tok_local,
                                            (C_Token *)node);
                  }
                  else {
                    _Var3 = C_equal((C_Token *)node,"goto");
                    if (_Var3) {
                      _Var3 = C_equal((C_Token *)node->next,"*");
                      if (_Var3) {
                        pCVar8 = (C_Parser *)
                                 new_node((C_Parser *)rest_local,ND_GOTO_EXPR,(C_Token *)node);
                        pCVar10 = expr((C_Parser *)rest_local,(C_Token **)&node,
                                       (C_Token *)node->next->next);
                        pCVar8->locals = (C_Obj *)pCVar10;
                        pCVar7 = C_skip((C_Parser *)rest_local,(C_Token *)node,";");
                        *(C_Token **)tok_local = pCVar7;
                        parser_local = pCVar8;
                      }
                      else {
                        pCVar8 = (C_Parser *)
                                 new_node((C_Parser *)rest_local,ND_GOTO,(C_Token *)node);
                        pCVar9 = (C_MemoryAllocator *)
                                 get_ident((C_Parser *)rest_local,(C_Token *)node->next);
                        (pCVar8->typewords).allocator = pCVar9;
                        pCVar8->env[0].__jmpbuf[0] = (long)rest_local[8];
                        rest_local[8] = (C_Token *)pCVar8;
                        pCVar7 = C_skip((C_Parser *)rest_local,(C_Token *)node->next->next,";");
                        *(C_Token **)tok_local = pCVar7;
                        parser_local = pCVar8;
                      }
                    }
                    else {
                      _Var3 = C_equal((C_Token *)node,"break");
                      if (_Var3) {
                        if (rest_local[10] == (C_Token *)0x0) {
                          C_error_tok((C_Parser *)rest_local,(C_Token *)node,"stray break");
                        }
                        pCVar8 = (C_Parser *)
                                 new_node((C_Parser *)rest_local,ND_GOTO,(C_Token *)node);
                        pCVar8->memory_allocator = (C_MemoryAllocator *)rest_local[10];
                        pCVar7 = C_skip((C_Parser *)rest_local,(C_Token *)node->next,";");
                        *(C_Token **)tok_local = pCVar7;
                        parser_local = pCVar8;
                      }
                      else {
                        _Var3 = C_equal((C_Token *)node,"continue");
                        if (_Var3) {
                          if (rest_local[0xb] == (C_Token *)0x0) {
                            C_error_tok((C_Parser *)rest_local,(C_Token *)node,"stray continue");
                          }
                          pCVar8 = (C_Parser *)
                                   new_node((C_Parser *)rest_local,ND_GOTO,(C_Token *)node);
                          pCVar8->memory_allocator = (C_MemoryAllocator *)rest_local[0xb];
                          pCVar7 = C_skip((C_Parser *)rest_local,(C_Token *)node->next,";");
                          *(C_Token **)tok_local = pCVar7;
                          parser_local = pCVar8;
                        }
                        else if ((node->kind == ND_NULL_EXPR) &&
                                (_Var3 = C_equal((C_Token *)node->next,":"), _Var3)) {
                          pCVar8 = (C_Parser *)
                                   new_node((C_Parser *)rest_local,ND_LABEL,(C_Token *)node);
                          pCVar9 = (C_MemoryAllocator *)
                                   str_dup((C_MemoryAllocator *)rest_local[0x14],(char *)node->cond,
                                           (long)*(int *)&node->then);
                          (pCVar8->typewords).allocator = pCVar9;
                          pCVar9 = (C_MemoryAllocator *)
                                   new_unique_name((C_MemoryAllocator *)rest_local[0x14]);
                          pCVar8->memory_allocator = pCVar9;
                          pCVar10 = stmt((C_Parser *)rest_local,(C_Token **)tok_local,
                                         (C_Token *)node->next->next);
                          pCVar8->locals = (C_Obj *)pCVar10;
                          pCVar8->env[0].__jmpbuf[0] = (long)rest_local[9];
                          rest_local[9] = (C_Token *)pCVar8;
                          parser_local = pCVar8;
                        }
                        else {
                          _Var3 = C_equal((C_Token *)node,"{");
                          if (_Var3) {
                            parser_local = (C_Parser *)
                                           compound_stmt((C_Parser *)rest_local,
                                                         (C_Token **)tok_local,(C_Token *)node->next
                                                        );
                          }
                          else {
                            parser_local = (C_Parser *)
                                           expr_stmt((C_Parser *)rest_local,(C_Token **)tok_local,
                                                     (C_Token *)node);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (C_Node *)parser_local;
}

Assistant:

static C_Node *stmt(C_Parser *parser, C_Token **rest, C_Token *tok) {
  if (C_equal(tok, "return")) {
    C_Node *node = new_node(parser, ND_RETURN, tok);
    if (C_consume(rest, tok->next, ";"))
      return node;

    C_Node *exp = expr(parser, &tok, tok->next);
    *rest = C_skip(parser, tok, ";");

    C_add_type(parser, exp);
    C_Type *ty = parser->current_fn->ty->return_ty;
    if (ty->kind != TY_STRUCT && ty->kind != TY_UNION)
      exp = C_new_cast(parser, exp, parser->current_fn->ty->return_ty);

    node->lhs = exp;
    return node;
  }

  if (C_equal(tok, "if")) {
    C_Node *node = new_node(parser, ND_IF, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");
    node->then = stmt(parser, &tok, tok);
    if (C_equal(tok, "else"))
      node->els = stmt(parser, &tok, tok->next);
    *rest = tok;
    return node;
  }

  if (C_equal(tok, "switch")) {
    C_Node *node = new_node(parser, ND_SWITCH, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    C_Node *sw = parser->current_switch;
    parser->current_switch = node;

    char *brk = parser->brk_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, rest, tok);

    parser->current_switch = sw;
    parser->brk_label = brk;
    return node;
  }

  if (C_equal(tok, "case")) {
    if (!parser->current_switch)
      C_error_tok(parser, tok, "stray case");

    C_Node *node = new_node(parser, ND_CASE, tok);
    int begin = C_const_expr(parser, &tok, tok->next);
    int end;

    if (C_equal(tok, "...")) {
      // [GNU] Case ranges, e.g. "case 1 ... 5:"
      end = C_const_expr(parser, &tok, tok->next);
      if (end < begin)
        C_error_tok(parser, tok, "empty case range specified");
    } else {
      end = begin;
    }

    tok = C_skip(parser, tok, ":");
    node->label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok);
    node->begin = begin;
    node->end = end;
    node->case_next = parser->current_switch->case_next;
    parser->current_switch->case_next = node;
    return node;
  }

  if (C_equal(tok, "default")) {
    if (!parser->current_switch)
      C_error_tok(parser, tok, "stray default");

    C_Node *node = new_node(parser, ND_CASE, tok);
    tok = C_skip(parser, tok->next, ":");
    node->label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok);
    parser->current_switch->default_case = node;
    return node;
  }

  if (C_equal(tok, "for")) {
    C_Node *node = new_node(parser, ND_FOR, tok);
    tok = C_skip(parser, tok->next, "(");

    enter_scope(parser);

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    if (is_typename(parser, tok)) {
      C_Type *basety = declspec(parser, &tok, tok, NULL);
      node->init = declaration(parser, &tok, tok, basety, NULL);
    } else {
      node->init = expr_stmt(parser, &tok, tok);
    }

    if (!C_equal(tok, ";"))
      node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ";");

    if (!C_equal(tok, ")"))
      node->inc = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    node->then = stmt(parser, rest, tok);

    leave_scope(parser);
    parser->brk_label = brk;
    parser->cont_label = cont;
    return node;
  }

  if (C_equal(tok, "while")) {
    C_Node *node = new_node(parser, ND_FOR, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, rest, tok);

    parser->brk_label = brk;
    parser->cont_label = cont;
    return node;
  }

  if (C_equal(tok, "do")) {
    C_Node *node = new_node(parser, ND_DO, tok);

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, &tok, tok->next);

    parser->brk_label = brk;
    parser->cont_label = cont;

    tok = C_skip(parser, tok, "while");
    tok = C_skip(parser, tok, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");
    *rest = C_skip(parser, tok, ";");
    return node;
  }

  if (C_equal(tok, "asm"))
    return asm_stmt(parser, rest, tok);

  if (C_equal(tok, "goto")) {
    if (C_equal(tok->next, "*")) {
      // [GNU] `goto *ptr` jumps to the address specified by `ptr`.
      C_Node *node = new_node(parser, ND_GOTO_EXPR, tok);
      node->lhs = expr(parser, &tok, tok->next->next);
      *rest = C_skip(parser, tok, ";");
      return node;
    }

    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->label = get_ident(parser, tok->next);
    node->goto_next = parser->gotos;
    parser->gotos = node;
    *rest = C_skip(parser, tok->next->next, ";");
    return node;
  }

  if (C_equal(tok, "break")) {
    if (!parser->brk_label)
      C_error_tok(parser, tok, "stray break");
    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->unique_label = parser->brk_label;
    *rest = C_skip(parser, tok->next, ";");
    return node;
  }

  if (C_equal(tok, "continue")) {
    if (!parser->cont_label)
      C_error_tok(parser, tok, "stray continue");
    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->unique_label = parser->cont_label;
    *rest = C_skip(parser, tok->next, ";");
    return node;
  }

  if (tok->kind == TK_IDENT && C_equal(tok->next, ":")) {
    C_Node *node = new_node(parser, ND_LABEL, tok);
    node->label = str_dup(parser->memory_allocator, tok->loc, tok->len);
    node->unique_label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok->next->next);
    node->goto_next = parser->labels;
    parser->labels = node;
    return node;
  }

  if (C_equal(tok, "{"))
    return compound_stmt(parser, rest, tok->next);

  return expr_stmt(parser, rest, tok);
}